

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O2

void __thiscall UDMFParser::UDMFParser(UDMFParser *this,FMissingTextureTracker *missing)

{
  UDMFParserBase::UDMFParserBase(&this->super_UDMFParserBase);
  (this->ParsedVertexDatas).Array = (vertexdata_t *)0x0;
  (this->ParsedVertexDatas).Most = 0;
  (this->ParsedVertexDatas).Count = 0;
  (this->ParsedVertices).Array = (vertex_t *)0x0;
  (this->ParsedVertices).Most = 0;
  (this->ParsedVertices).Count = 0;
  (this->ParsedSectors).Array = (sector_t *)0x0;
  (this->ParsedSectors).Most = 0;
  (this->ParsedSectors).Count = 0;
  (this->ParsedSideTextures).Array = (intmapsidedef_t *)0x0;
  (this->ParsedSideTextures).Most = 0;
  (this->ParsedSideTextures).Count = 0;
  (this->ParsedSides).Array = (side_t *)0x0;
  (this->ParsedSides).Most = 0;
  (this->ParsedSides).Count = 0;
  (this->ParsedLines).Array = (line_t *)0x0;
  (this->ParsedLines).Most = 0;
  (this->ParsedLines).Count = 0;
  this->missingTex = missing;
  TArray<int,_int>::Clear(&linemap);
  this->fogMap = (FDynamicColormap *)0x0;
  this->normMap = (FDynamicColormap *)0x0;
  return;
}

Assistant:

UDMFParser(FMissingTextureTracker &missing)
		: missingTex(missing)
	{
		linemap.Clear();
		fogMap = normMap = NULL;
	}